

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureSocket.cpp
# Opt level: O1

void __thiscall Jupiter::SecureSocket::SecureSocket(SecureSocket *this)

{
  SSLData *pSVar1;
  
  Socket::Socket(&this->super_Socket);
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR_connect_00147870;
  pSVar1 = (SSLData *)operator_new(0x58);
  pSVar1->method = (SSL_METHOD *)0x0;
  (pSVar1->cert)._M_dataplus._M_p = (pointer)0x0;
  (pSVar1->cert)._M_string_length = 0;
  (pSVar1->cert).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pSVar1->cert).field_2 + 8) = 0;
  (pSVar1->key)._M_dataplus._M_p = (pointer)0x0;
  (pSVar1->key)._M_string_length = 0;
  (pSVar1->key).field_2._M_allocated_capacity = 0;
  pSVar1->handle = (SSL *)0x0;
  pSVar1->context = (SSL_CTX *)0x0;
  *(undefined8 *)((long)&(pSVar1->key).field_2 + 8) = 0;
  (pSVar1->cert)._M_dataplus._M_p = (pointer)&(pSVar1->cert).field_2;
  (pSVar1->cert)._M_string_length = 0;
  (pSVar1->cert).field_2._M_local_buf[0] = '\0';
  (pSVar1->key)._M_dataplus._M_p = (pointer)&(pSVar1->key).field_2;
  (pSVar1->key)._M_string_length = 0;
  (pSVar1->key).field_2._M_local_buf[0] = '\0';
  this->m_ssl_data = pSVar1;
  return;
}

Assistant:

Jupiter::SecureSocket::SecureSocket() : Jupiter::Socket() {
	m_ssl_data = new Jupiter::SecureSocket::SSLData();
}